

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

int hex_char_to_int(char c)

{
  undefined4 local_c;
  char c_local;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'a') || ('f' < c)) {
      if ((c < 'A') || ('F' < c)) {
        local_c = -1;
      }
      else {
        local_c = c + -0x37;
      }
    }
    else {
      local_c = c + -0x57;
    }
  }
  else {
    local_c = c + -0x30;
  }
  return local_c;
}

Assistant:

static int hex_char_to_int(char c) {
    if (c >= '0' && c <= '9') {
        return c - '0';
    } else if (c >= 'a' && c <= 'f') {
        return c - 'a' + 10;
    } else if (c >= 'A' && c <= 'F') {
        return c - 'A' + 10;
    }
    return -1;
}